

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void __thiscall vkt::ubo::VarType::VarType(VarType *this,VarType *elementType,int arraySize)

{
  VarType *this_00;
  int arraySize_local;
  VarType *elementType_local;
  VarType *this_local;
  
  this->m_type = TYPE_ARRAY;
  this->m_flags = 0;
  Data::Data((Data *)&(this->m_data).array);
  (this->m_data).array.size = arraySize;
  this_00 = (VarType *)operator_new(0x18);
  VarType(this_00,elementType);
  (this->m_data).array.elementType = this_00;
  return;
}

Assistant:

VarType::VarType (const VarType& elementType, int arraySize)
	: m_type	(TYPE_ARRAY)
	, m_flags	(0)
{
	m_data.array.size			= arraySize;
	m_data.array.elementType	= new VarType(elementType);
}